

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O0

Fl_Window * __thiscall Fl_Widget::top_window_offset(Fl_Widget *this,int *xoff,int *yoff)

{
  int iVar1;
  Fl_Window *pFVar2;
  undefined4 extraout_var;
  bool bVar3;
  Fl_Window *local_28;
  Fl_Widget *w;
  int *yoff_local;
  int *xoff_local;
  Fl_Widget *this_local;
  
  *yoff = 0;
  *xoff = 0;
  local_28 = (Fl_Window *)this;
  while( true ) {
    bVar3 = false;
    if (local_28 != (Fl_Window *)0x0) {
      pFVar2 = window((Fl_Widget *)local_28);
      bVar3 = pFVar2 != (Fl_Window *)0x0;
    }
    if (!bVar3) break;
    iVar1 = x((Fl_Widget *)local_28);
    *xoff = iVar1 + *xoff;
    iVar1 = y((Fl_Widget *)local_28);
    *yoff = iVar1 + *yoff;
    local_28 = window((Fl_Widget *)local_28);
  }
  iVar1 = (*(local_28->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[8])();
  return (Fl_Window *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Fl_Window* Fl_Widget::top_window_offset(int& xoff, int& yoff) const {
  xoff = yoff = 0;
  const Fl_Widget *w = this;
  while (w && w->window()) {
    xoff += w->x();			// accumulate offsets
    yoff += w->y();
    w = w->window();			// walk up window hierarchy
  }
  return const_cast<Fl_Widget*>(w)->as_window();
}